

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

void Curl_formclean(FormData **form_ptr)

{
  FormData *pFVar1;
  FormData *pFVar2;
  
  pFVar2 = *form_ptr;
  if (pFVar2 != (FormData *)0x0) {
    do {
      pFVar1 = pFVar2->next;
      if (pFVar2->type < FORM_CALLBACK) {
        (*Curl_cfree)(pFVar2->line);
      }
      (*Curl_cfree)(pFVar2);
      pFVar2 = pFVar1;
    } while (pFVar1 != (FormData *)0x0);
    *form_ptr = (FormData *)0x0;
  }
  return;
}

Assistant:

void Curl_formclean(struct FormData **form_ptr)
{
  struct FormData *next, *form;

  form = *form_ptr;
  if(!form)
    return;

  do {
    next=form->next;  /* the following form line */
    if(form->type <= FORM_CONTENT)
      free(form->line); /* free the line */
    free(form);       /* free the struct */

  } while((form = next) != NULL); /* continue */

  *form_ptr = NULL;
}